

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::ParseSourceName(State *state)

{
  char cVar1;
  char *str;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  short sVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  size_t i;
  long lVar14;
  ulong uVar15;
  char cVar16;
  ulong uVar17;
  State copy;
  uint local_1c [2];
  int length;
  
  pcVar2 = state->mangled_cur;
  pcVar3 = state->out_cur;
  pcVar4 = state->out_begin;
  pcVar5 = state->out_end;
  pcVar6 = state->prev_name;
  iVar7 = state->prev_name_length;
  sVar8 = state->nest_level;
  bVar9 = state->append;
  bVar10 = state->overflowed;
  local_1c[0] = 0xffffffff;
  bVar13 = ParseNumber(state,(int *)local_1c);
  uVar11 = local_1c[0];
  if ((!bVar13) || (uVar17 = (ulong)local_1c[0], uVar17 == 0xffffffff)) goto LAB_0012b0d8;
  str = state->mangled_cur;
  if (0 < (int)local_1c[0]) {
    cVar1 = *str;
    if (cVar1 == '\0') {
LAB_0012b0d8:
      state->out_begin = pcVar4;
      state->out_end = pcVar5;
      state->prev_name = pcVar6;
      state->prev_name_length = iVar7;
      state->nest_level = sVar8;
      state->append = bVar9;
      state->overflowed = bVar10;
      state->mangled_cur = pcVar2;
      state->out_cur = pcVar3;
      state->out_begin = pcVar4;
      state->out_end = pcVar5;
      return false;
    }
    uVar15 = 0;
    do {
      if (uVar17 - 1 == uVar15) goto LAB_0012b0ef;
      lVar12 = uVar15 + 1;
      uVar15 = uVar15 + 1;
    } while (str[lVar12] != '\0');
    if (uVar15 < uVar17) goto LAB_0012b0d8;
LAB_0012b0ef:
    if (0xb < (int)local_1c[0]) {
      lVar12 = 0;
      do {
        lVar14 = lVar12;
        cVar16 = "_GLOBAL__N_"[lVar14];
        if (cVar1 != cVar16) goto LAB_0012b116;
        cVar1 = str[lVar14 + 1];
        lVar12 = lVar14 + 1;
      } while (cVar1 != '\0');
      cVar16 = "_GLOBAL__N_"[lVar14 + 1];
LAB_0012b116:
      if (cVar16 == '\0') {
        MaybeAppend(state,"(anonymous namespace)");
        goto LAB_0012b126;
      }
    }
  }
  MaybeAppendWithLength(state,str,local_1c[0]);
LAB_0012b126:
  state->mangled_cur = state->mangled_cur + (int)uVar11;
  return true;
}

Assistant:

static bool ParseSourceName(State *state) {
  State copy = *state;
  int length = -1;
  if (ParseNumber(state, &length) && ParseIdentifier(state, length)) {
    return true;
  }
  *state = copy;
  return false;
}